

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int pager_read_db_header(Pager *pPager)

{
  int iVar1;
  sxu32 sVar2;
  undefined8 *puVar3;
  unqlite_kv_methods *pMethods_00;
  void *pvVar4;
  char *zErr;
  long local_240;
  pgno nPage;
  SyString *pKv;
  unqlite_kv_methods *pMethods;
  long lStack_220;
  int rc;
  sxi64 n;
  uchar zRaw [512];
  Pager *pPager_local;
  
  lStack_220 = 0;
  zRaw._504_8_ = pPager;
  iVar1 = unqliteOsFileSize(pPager->pfd,&stack0xfffffffffffffde0);
  if (iVar1 != 0) {
    return iVar1;
  }
  *(long *)(zRaw._504_8_ + 0x50) = lStack_220;
  if (lStack_220 < 1) {
    iVar1 = GetSectorSize(*(unqlite_file **)(zRaw._504_8_ + 0x30));
    *(int *)(zRaw._504_8_ + 0x20c) = iVar1;
    iVar1 = unqliteGetPageSize();
    *(int *)(zRaw._504_8_ + 0x208) = iVar1;
    *(undefined8 *)(zRaw._504_8_ + 0x1e0) = **(undefined8 **)(**(long **)(zRaw._504_8_ + 0x10) + 8);
    sVar2 = SyStrlen((char *)**(undefined8 **)(**(long **)(zRaw._504_8_ + 0x10) + 8));
    *(sxu32 *)(zRaw._504_8_ + 0x1e8) = sVar2;
    *(undefined8 *)(zRaw._504_8_ + 0x40) = 0;
  }
  else {
    if (lStack_220 < 0x200) {
      unqliteGenError(*(unqlite **)(zRaw._504_8_ + 8),"Malformed database image");
      return -0x18;
    }
    iVar1 = unqliteOsRead(*(unqlite_file **)(zRaw._504_8_ + 0x30),&n,0x200,0);
    if (iVar1 != 0) {
      unqliteGenError(*(unqlite **)(zRaw._504_8_ + 8),"IO error while reading database header");
      return iVar1;
    }
    iVar1 = pager_extract_header((Pager *)zRaw._504_8_,(uchar *)&n,0x200);
    if (iVar1 != 0) {
      zErr = "Malformed database image";
      if (iVar1 == -1) {
        zErr = "Unqlite is running out of memory";
      }
      unqliteGenError(*(unqlite **)(zRaw._504_8_ + 8),zErr);
      return iVar1;
    }
    local_240 = lStack_220 / (long)*(int *)(zRaw._504_8_ + 0x208);
    if ((local_240 == 0) && (0 < lStack_220)) {
      local_240 = 1;
    }
    *(long *)(zRaw._504_8_ + 0x40) = local_240;
    puVar3 = (undefined8 *)(zRaw._504_8_ + 0x1e0);
    pMethods_00 = unqliteFindKVStore((char *)*puVar3,*(sxu32 *)(zRaw._504_8_ + 0x1e8));
    if (pMethods_00 == (unqlite_kv_methods *)0x0) {
      unqliteGenErrorFormat
                (*(unqlite **)(zRaw._504_8_ + 8),"No such Key/Value storage engine \'%z\'",puVar3);
      return -0x11;
    }
    iVar1 = unqlitePagerRegisterKvEngine((Pager *)zRaw._504_8_,pMethods_00);
    if (iVar1 != 0) {
      return iVar1;
    }
  }
  pvVar4 = SyMemBackendAlloc(*(SyMemBackend **)zRaw._504_8_,*(sxu32 *)(zRaw._504_8_ + 0x208));
  *(void **)(zRaw._504_8_ + 0x210) = pvVar4;
  if (*(long *)(zRaw._504_8_ + 0x210) == 0) {
    unqliteGenOutofMem(*(unqlite **)(zRaw._504_8_ + 8));
    pPager_local._4_4_ = -1;
  }
  else {
    SyZero(*(void **)(zRaw._504_8_ + 0x210),*(sxu32 *)(zRaw._504_8_ + 0x208));
    pPager_local._4_4_ = 0;
  }
  return pPager_local._4_4_;
}

Assistant:

static int pager_read_db_header(Pager *pPager)
{
	unsigned char zRaw[UNQLITE_MIN_PAGE_SIZE]; /* Minimum page size */
	sxi64 n = 0;              /* Size of db file in bytes */
	int rc;
	/* Get the file size first */
	rc = unqliteOsFileSize(pPager->pfd,&n);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	pPager->dbByteSize = n;
	if( n > 0 ){
		unqlite_kv_methods *pMethods;
		SyString *pKv;
		pgno nPage;
		if( n < UNQLITE_MIN_PAGE_SIZE ){
			/* A valid unqlite database must be at least 512 bytes long */
			unqliteGenError(pPager->pDb,"Malformed database image");
			return UNQLITE_CORRUPT;
		}
		/* Read the database header */
		rc = unqliteOsRead(pPager->pfd,zRaw,sizeof(zRaw),0);
		if( rc != UNQLITE_OK ){
			unqliteGenError(pPager->pDb,"IO error while reading database header");
			return rc;
		}
		/* Extract the header */
		rc = pager_extract_header(pPager,zRaw,sizeof(zRaw));
		if( rc != UNQLITE_OK ){
			unqliteGenError(pPager->pDb,rc == UNQLITE_NOMEM ? "Unqlite is running out of memory" : "Malformed database image");
			return rc;
		}
		/* Update pager state  */
		nPage = (pgno)(n / pPager->iPageSize);
		if( nPage==0 && n>0 ){
			nPage = 1;
		}
		pPager->dbSize = nPage;
		/* Laod the target Key/Value storage engine */
		pKv = &pPager->sKv;
		pMethods = unqliteFindKVStore(pKv->zString,pKv->nByte);
		if( pMethods == 0 ){
			unqliteGenErrorFormat(pPager->pDb,"No such Key/Value storage engine '%z'",pKv);
			return UNQLITE_NOTIMPLEMENTED;
		}
		/* Install the new KV storage engine */
		rc = unqlitePagerRegisterKvEngine(pPager,pMethods);
		if( rc != UNQLITE_OK ){
			return rc;
		}
	}else{
		/* Set a default page and sector size */
		pPager->iSectorSize = GetSectorSize(pPager->pfd);
		pPager->iPageSize = unqliteGetPageSize();
		SyStringInitFromBuf(&pPager->sKv,pPager->pEngine->pIo->pMethods->zName,SyStrlen(pPager->pEngine->pIo->pMethods->zName));
		pPager->dbSize = 0;
	}
	/* Allocate a temporary page size */
	pPager->zTmpPage = (unsigned char *)SyMemBackendAlloc(pPager->pAllocator,(sxu32)pPager->iPageSize);
	if( pPager->zTmpPage == 0 ){
		unqliteGenOutofMem(pPager->pDb);
		return UNQLITE_NOMEM;
	}
	SyZero(pPager->zTmpPage,(sxu32)pPager->iPageSize);
	return UNQLITE_OK;
}